

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

int write_header(FIOBJ o,void *w_)

{
  FIOBJ FVar1;
  size_t sVar2;
  undefined1 local_58 [8];
  fio_str_info_s str;
  fio_str_info_s name;
  header_writer_s *w;
  void *w__local;
  FIOBJ o_local;
  
  if (o != 0) {
    FVar1 = fiobj_hash_key_in_loop();
    if (FVar1 != 0) {
      FVar1 = fiobj_hash_key_in_loop();
      *(FIOBJ *)((long)w_ + 8) = FVar1;
    }
    sVar2 = fiobj_type_is(o,FIOBJ_T_ARRAY);
    if (sVar2 == 0) {
      fiobj_obj2cstr((fio_str_info_s *)&str.data,*(FIOBJ *)((long)w_ + 8));
      fiobj_obj2cstr((fio_str_info_s *)local_58,o);
      if (str.len != 0) {
        fiobj_str_write(*w_,(char *)name.len,name.capa);
        fiobj_str_write(*w_,":",1);
        fiobj_str_write(*w_,(char *)str.len,str.capa);
        fiobj_str_write(*w_,"\r\n",2);
      }
    }
    else {
      fiobj_each1(o,0,write_header,w_);
    }
  }
  return 0;
}

Assistant:

static int write_header(FIOBJ o, void *w_) {
  struct header_writer_s *w = w_;
  if (!o)
    return 0;
  if (fiobj_hash_key_in_loop()) {
    w->name = fiobj_hash_key_in_loop();
  }
  if (FIOBJ_TYPE_IS(o, FIOBJ_T_ARRAY)) {
    fiobj_each1(o, 0, write_header, w);
    return 0;
  }
  fio_str_info_s name = fiobj_obj2cstr(w->name);
  fio_str_info_s str = fiobj_obj2cstr(o);
  if (!str.data)
    return 0;
  fiobj_str_write(w->dest, name.data, name.len);
  fiobj_str_write(w->dest, ":", 1);
  fiobj_str_write(w->dest, str.data, str.len);
  fiobj_str_write(w->dest, "\r\n", 2);
  return 0;
}